

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QtPrivate::QTypeNormalizer::starts_with_token(char *b,char *e,char *token,bool msvcKw)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  lVar2 = (long)e - (long)b;
  pcVar3 = token;
  while( true ) {
    if (b == e) {
      return token[lVar2] == '\0';
    }
    if (*pcVar3 == '\0') break;
    if (*b != *pcVar3) {
      return false;
    }
    b = b + 1;
    pcVar3 = pcVar3 + 1;
  }
  bVar1 = is_ident_char(*b);
  return !bVar1;
}

Assistant:

static constexpr bool starts_with_token(const char *b, const char *e, const char *token,
                                            bool msvcKw = false)
    {
        while (b != e && *token && *b == *token) {
            b++;
            token++;
        }
        if (*token)
            return false;
#ifdef Q_CC_MSVC
        /// On MSVC, keywords like class or struct are not separated with spaces in constexpr
        /// context
        if (msvcKw && !is_ident_char(*b))
            return true;
#endif
        Q_UNUSED(msvcKw);
        return b == e || !is_ident_char(*b);
    }